

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O3

int __thiscall ExtraData::parseCodePageStream(ExtraData *this,TypedPropertyValue *value,int from)

{
  int iVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  int iVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"MUST be a CodePageString.",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"              Value:                ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 CodePageString:    ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  __x = &value->Value;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__x);
  iVar1 = Utils::lenFourBytesFromPos(&local_48,from);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                     Size:          ",0x24);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"The size in bytes of the Characters field, including the null terminator, ",
             0x4a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"but not including padding (if any). If the property set\'s CodePage property ",
             0x4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"has the value CP_WINUNICODE (0x04B0), then the value MUST be a multiple of 2.",
             0x4d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar3 = 0x960;
  if (iVar1 != 0x4b0) {
    iVar3 = iVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                     Characters:    ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if (0 < iVar3) {
    iVar1 = Utils::getCountOfBytesBeforeNullTerminatorInt
                      ((const_iterator)
                       (__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start);
    Utils::print_vec_unicode_from_to(__x,from + 4,iVar1 + from);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"If Size is nonzero and the CodePage property set\'s CodePage property ",0x45);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "has the value CP_WINUNICODE (0x04B0), then the value MUST be a null-terminated array "
             ,0x55);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "of 16-bit Unicode characters, followed by zero padding to a multiple of 4 bytes.",0x50
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "If Size is nonzero and the property set\'s CodePage property has any other value, ",
             0x51);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"it MUST be a null-terminated array of 8-bit characters from the code page ",
             0x4a);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "identified by the CodePage property, followed by zero padding to a multiple of 4 bytes."
             ,0x57);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return iVar3 + 4;
}

Assistant:

int ExtraData::parseCodePageStream(ExtraData::PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue value, int from) {
    cout << Utils::defaultOffsetDocInfo << "MUST be a CodePageString." << endl;
    cout << "              Value:                " << endl;
    cout << "                 CodePageString:    " << endl;
    int len = Utils::lenFourBytesFromPos(value.Value, from);
    cout << "                     Size:          " << len << " bytes" << endl <<
         Utils::defaultOffsetDocInfo << "The size in bytes of the Characters field, including the null terminator, " << endl <<
         Utils::defaultOffsetDocInfo << "but not including padding (if any). If the property set's CodePage property " << endl <<
         Utils::defaultOffsetDocInfo << "has the value CP_WINUNICODE (0x04B0), then the value MUST be a multiple of 2." << endl;
    if(len == 0x04B0)
        len *= 2;
    cout << "                     Characters:    " << endl;
    if(len > 0) {;
        int posNullTerminator = Utils::getCountOfBytesBeforeNullTerminatorInt(value.Value.begin());
        if(len == 0x04B0) {
            Utils::print_vec_unicode_from_to(value.Value, from + 4, from + posNullTerminator);
        } else {
            Utils::print_vec_unicode_from_to(value.Value, from + 4, from + posNullTerminator);
        }
    }
    cout << Utils::defaultOffsetDocInfo << "If Size is nonzero and the CodePage property set's CodePage property " <<
         Utils::defaultOffsetDocInfo << "has the value CP_WINUNICODE (0x04B0), then the value MUST be a null-terminated array " <<
         Utils::defaultOffsetDocInfo << "of 16-bit Unicode characters, followed by zero padding to a multiple of 4 bytes." << endl <<

         Utils::defaultOffsetDocInfo << "If Size is nonzero and the property set's CodePage property has any other value, " <<
         Utils::defaultOffsetDocInfo << "it MUST be a null-terminated array of 8-bit characters from the code page " <<
         Utils::defaultOffsetDocInfo << "identified by the CodePage property, followed by zero padding to a multiple of 4 bytes." << endl;
    return len + 4;
}